

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTis.c
# Opt level: O0

void Gia_ManTisTest(Gia_Man_t *pInit)

{
  int iVar1;
  Vec_Int_t *vMffc_00;
  Vec_Int_t *vLeaves_00;
  Gia_Man_t *p_00;
  bool bVar2;
  int local_34;
  int i;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vMffc;
  Gia_Obj_t *pObj;
  Gia_Man_t *p;
  Gia_Man_t *pInit_local;
  
  vMffc_00 = Vec_IntAlloc(10);
  vLeaves_00 = Vec_IntAlloc(10);
  p_00 = Gia_ManTisDupMuxes(pInit);
  Gia_ManCreateRefs(p_00);
  local_34 = 0;
  while( true ) {
    bVar2 = false;
    if (local_34 < p_00->nObjs) {
      vMffc = (Vec_Int_t *)Gia_ManObj(p_00,local_34);
      bVar2 = vMffc != (Vec_Int_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsAnd((Gia_Obj_t *)vMffc);
    if ((iVar1 != 0) && (iVar1 = Gia_ObjRefNumId(p_00,local_34), iVar1 != 1)) {
      Gia_ManTisCollectMffc(p_00,local_34,vMffc_00,vLeaves_00);
      Gia_ManTisPrintMffc(p_00,local_34,vMffc_00,vLeaves_00);
    }
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p_00->vCos);
    bVar2 = false;
    if (local_34 < iVar1) {
      vMffc = (Vec_Int_t *)Gia_ManCo(p_00,local_34);
      bVar2 = vMffc != (Vec_Int_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjFaninId0p(p_00,(Gia_Obj_t *)vMffc);
    iVar1 = Gia_ObjRefNumId(p_00,iVar1);
    if (iVar1 < 2) {
      iVar1 = Gia_ObjFaninId0p(p_00,(Gia_Obj_t *)vMffc);
      Gia_ManTisCollectMffc(p_00,iVar1,vMffc_00,vLeaves_00);
      iVar1 = Gia_ObjFaninId0p(p_00,(Gia_Obj_t *)vMffc);
      Gia_ManTisPrintMffc(p_00,iVar1,vMffc_00,vLeaves_00);
    }
    local_34 = local_34 + 1;
  }
  Gia_ManStop(p_00);
  Vec_IntFree(vMffc_00);
  Vec_IntFree(vLeaves_00);
  return;
}

Assistant:

void Gia_ManTisTest( Gia_Man_t * pInit )
{
    Gia_Man_t * p;
    Gia_Obj_t * pObj;
    Vec_Int_t * vMffc, * vLeaves;
    int i;
    vMffc = Vec_IntAlloc( 10 );
    vLeaves = Vec_IntAlloc( 10 );
    p = Gia_ManTisDupMuxes( pInit );
    Gia_ManCreateRefs( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Gia_ObjRefNumId(p, i) == 1 )
            continue;
        Gia_ManTisCollectMffc( p, i, vMffc, vLeaves );
        Gia_ManTisPrintMffc( p, i, vMffc, vLeaves );
    }
    Gia_ManForEachCo( p, pObj, i )
    {
        if ( Gia_ObjRefNumId(p, Gia_ObjFaninId0p(p, pObj)) > 1 )
            continue;
        Gia_ManTisCollectMffc( p, Gia_ObjFaninId0p(p, pObj), vMffc, vLeaves );
        Gia_ManTisPrintMffc( p, Gia_ObjFaninId0p(p, pObj), vMffc, vLeaves );
    }
    Gia_ManStop( p );
    Vec_IntFree( vMffc );
    Vec_IntFree( vLeaves );
}